

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wycheproof_util.cc
# Opt level: O0

UniquePtr<BIGNUM> GetWycheproofBIGNUM(FileTest *t,char *key,bool instruction)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  char *pcVar5;
  undefined8 uVar6;
  BIGNUM *pBVar7;
  BIGNUM *a;
  BIGNUM *b;
  byte in_CL;
  undefined7 in_register_00000011;
  bool local_f2;
  unique_ptr<bignum_st,_bssl::internal::Deleter> local_c8;
  UniquePtr<BIGNUM> tmp;
  UniquePtr<BIGNUM> ret;
  BIGNUM *bn;
  string local_a8;
  byte local_85;
  byte local_72;
  allocator<char> local_71;
  string local_70;
  undefined1 local_49;
  undefined1 local_48 [7];
  bool ok;
  string value;
  bool instruction_local;
  char *key_local;
  FileTest *t_local;
  
  value.field_2._M_local_buf[0xf] = in_CL & 1;
  std::__cxx11::string::string((string *)local_48);
  local_72 = 0;
  local_85 = 0;
  bn._6_1_ = 0;
  bn._5_1_ = 0;
  if ((value.field_2._M_local_buf[0xf] & 1U) == 0) {
    std::allocator<char>::allocator();
    bn._6_1_ = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,(char *)CONCAT71(in_register_00000011,instruction),
               (allocator<char> *)((long)&bn + 7));
    bn._5_1_ = 1;
    local_f2 = FileTest::GetAttribute((FileTest *)key,(string *)local_48,&local_a8);
  }
  else {
    std::allocator<char>::allocator();
    local_72 = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,(char *)CONCAT71(in_register_00000011,instruction),&local_71);
    local_85 = 1;
    local_f2 = FileTest::GetInstruction((FileTest *)key,(string *)local_48,&local_70);
  }
  if ((bn._5_1_ & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_a8);
  }
  if ((bn._6_1_ & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)((long)&bn + 7));
  }
  if ((local_85 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_70);
  }
  if ((local_72 & 1) != 0) {
    std::allocator<char>::~allocator(&local_71);
  }
  local_49 = local_f2;
  if (local_f2 == false) {
    std::unique_ptr<bignum_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<bignum_st,bssl::internal::Deleter> *)t,(nullptr_t)0x0);
    bn._0_4_ = 1;
    goto LAB_0067f0fe;
  }
  ret._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl =
       (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)
       (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)0x0;
  uVar4 = std::__cxx11::string::size();
  if (uVar4 < 0x80000000) {
    pcVar5 = (char *)std::__cxx11::string::c_str();
    iVar2 = BN_hex2bn((BIGNUM **)&ret,pcVar5);
    iVar3 = std::__cxx11::string::size();
    if (iVar2 == iVar3) {
      std::unique_ptr<bignum_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
                ((unique_ptr<bignum_st,bssl::internal::Deleter> *)&tmp,
                 (pointer)ret._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                          super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl);
      uVar4 = std::__cxx11::string::empty();
      if (((uVar4 & 1) == 0) &&
         ((pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_48), *pcVar5 < '0' ||
          (pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_48), '7' < *pcVar5)))) {
        pBVar7 = BN_new();
        std::unique_ptr<bignum_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
                  ((unique_ptr<bignum_st,bssl::internal::Deleter> *)&local_c8,(pointer)pBVar7);
        bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_c8);
        if ((bVar1) && (uVar4 = std::__cxx11::string::size(), uVar4 < 0x20000000)) {
          pBVar7 = (BIGNUM *)std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&local_c8);
          iVar2 = std::__cxx11::string::size();
          iVar2 = BN_set_bit(pBVar7,iVar2 << 2);
          if (iVar2 == 0) goto LAB_0067f05b;
          pBVar7 = (BIGNUM *)std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&tmp);
          a = (BIGNUM *)std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&tmp);
          b = (BIGNUM *)std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&local_c8);
          iVar2 = BN_sub(pBVar7,a,b);
          if (iVar2 == 0) goto LAB_0067f05b;
          bn._0_4_ = 0;
        }
        else {
LAB_0067f05b:
          std::unique_ptr<bignum_st,bssl::internal::Deleter>::
          unique_ptr<bssl::internal::Deleter,void>
                    ((unique_ptr<bignum_st,bssl::internal::Deleter> *)t,(nullptr_t)0x0);
          bn._0_4_ = 1;
        }
        std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr(&local_c8);
        if ((int)bn == 0) goto LAB_0067f0c5;
      }
      else {
LAB_0067f0c5:
        std::unique_ptr<bignum_st,_bssl::internal::Deleter>::unique_ptr
                  ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)t,&tmp);
        bn._0_4_ = 1;
      }
      std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr(&tmp);
      goto LAB_0067f0fe;
    }
  }
  BN_free((BIGNUM *)
          ret._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl);
  uVar6 = std::__cxx11::string::c_str();
  FileTest::PrintLine((FileTest *)key,"Could not decode value \'%s\'",uVar6);
  std::unique_ptr<bignum_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<bignum_st,bssl::internal::Deleter> *)t,(nullptr_t)0x0);
  bn._0_4_ = 1;
LAB_0067f0fe:
  std::__cxx11::string::~string((string *)local_48);
  return (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)t;
}

Assistant:

bssl::UniquePtr<BIGNUM> GetWycheproofBIGNUM(FileTest *t, const char *key,
                                            bool instruction) {
  std::string value;
  bool ok = instruction ? t->GetInstruction(&value, key)
                        : t->GetAttribute(&value, key);
  if (!ok) {
    return nullptr;
  }
  BIGNUM *bn = nullptr;
  if (value.size() > INT_MAX ||
      BN_hex2bn(&bn, value.c_str()) != static_cast<int>(value.size())) {
    BN_free(bn);
    t->PrintLine("Could not decode value '%s'", value.c_str());
    return nullptr;
  }
  bssl::UniquePtr<BIGNUM> ret(bn);
  if (!value.empty()) {
    // If the high bit is one, this is a negative number in Wycheproof.
    // Wycheproof's tests generally mimic Java APIs, including all their
    // mistakes. See
    // https://github.com/google/wycheproof/blob/0329f5b751ef102bd6b7b7181b6e049522a887f5/java/com/google/security/wycheproof/JsonUtil.java#L62.
    if ('0' > value[0] || value[0] > '7') {
      bssl::UniquePtr<BIGNUM> tmp(BN_new());
      if (!tmp ||  //
          value.size() > INT_MAX / 4 ||
          !BN_set_bit(tmp.get(), static_cast<int>(value.size() * 4)) ||
          !BN_sub(ret.get(), ret.get(), tmp.get())) {
        return nullptr;
      }
    }
  }
  return ret;
}